

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-256.c
# Opt level: O3

PHashSHA2_256 * pp_crypto_hash_sha2_256_new_internal(pboolean is224)

{
  PHashSHA2_256 *pPVar1;
  puint32 pVar2;
  puint32 pVar3;
  puint32 pVar4;
  puint32 pVar5;
  puint32 pVar6;
  puint32 pVar7;
  puint32 pVar8;
  puint32 pVar9;
  
  pPVar1 = (PHashSHA2_256 *)p_malloc0(0x6c);
  if (pPVar1 != (PHashSHA2_256 *)0x0) {
    pPVar1->is224 = is224;
    *(undefined8 *)&pPVar1->buf = 0;
    *(undefined8 *)((long)&pPVar1->buf + 8) = 0;
    *(undefined8 *)((long)&pPVar1->buf + 0x10) = 0;
    *(undefined8 *)((long)&pPVar1->buf + 0x18) = 0;
    *(undefined8 *)((long)&pPVar1->buf + 0x20) = 0;
    *(undefined8 *)((long)&pPVar1->buf + 0x28) = 0;
    *(undefined8 *)((long)&pPVar1->buf + 0x30) = 0;
    *(undefined8 *)((long)&pPVar1->buf + 0x38) = 0;
    pPVar1->len_high = 0;
    pPVar1->len_low = 0;
    if (is224 == 0) {
      pVar2 = 0x6a09e667;
      pVar3 = 0xbb67ae85;
      pVar4 = 0x3c6ef372;
      pVar5 = 0xa54ff53a;
      pVar6 = 0x510e527f;
      pVar7 = 0x9b05688c;
      pVar8 = 0x1f83d9ab;
      pVar9 = 0x5be0cd19;
    }
    else {
      pVar2 = 0xc1059ed8;
      pVar3 = 0x367cd507;
      pVar4 = 0x3070dd17;
      pVar5 = 0xf70e5939;
      pVar6 = 0xffc00b31;
      pVar7 = 0x68581511;
      pVar8 = 0x64f98fa7;
      pVar9 = 0xbefa4fa4;
    }
    pPVar1->hash[0] = pVar2;
    pPVar1->hash[1] = pVar3;
    pPVar1->hash[2] = pVar4;
    pPVar1->hash[3] = pVar5;
    pPVar1->hash[4] = pVar6;
    pPVar1->hash[5] = pVar7;
    pPVar1->hash[6] = pVar8;
    pPVar1->hash[7] = pVar9;
    return pPVar1;
  }
  return (PHashSHA2_256 *)0x0;
}

Assistant:

static PHashSHA2_256 *
pp_crypto_hash_sha2_256_new_internal (pboolean is224)
{
	PHashSHA2_256 *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PHashSHA2_256))) == NULL))
		return NULL;

	ret->is224 = is224;

	p_crypto_hash_sha2_256_reset (ret);

	return ret;
}